

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-rand.c
# Opt level: O1

uint32_t Rand_div(uint32_t m)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (0x10000000 < m) {
    __assert_fail("m <= 0x10000000",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-rand.c"
                  ,0xad,"uint32_t Rand_div(uint32_t)");
  }
  uVar2 = 0;
  if (1 < m) {
    if (rand_fixed == '\x01') {
      uVar2 = ((m * 1000 + -1000) * rand_fixval) / 100000;
    }
    else if (Rand_quick) {
      do {
        Rand_value = Rand_value * 0x41c64e6d + 0x3039;
        uVar2 = (uint)((ulong)(Rand_value >> 4) / (0x10000000 / (ulong)m));
      } while (m <= uVar2);
    }
    else {
      uVar3 = (ulong)state_i;
      do {
        iVar1 = (int)uVar3;
        state_i = iVar1 - 1U & 0x1f;
        uVar4 = (ulong)state_i;
        z0 = STATE[uVar4];
        z2 = STATE[iVar1 + 0x18U & 0x1f] ^ STATE[iVar1 + 10U & 0x1f] ^
             STATE[iVar1 + 10U & 0x1f] << 0xe ^ STATE[iVar1 + 0x18U & 0x1f] << 0x13;
        z1 = STATE[iVar1 + 3U & 0x1f] >> 8 ^ STATE[uVar3] ^ STATE[iVar1 + 3U & 0x1f];
        STATE[uVar3] = z2 ^ z1;
        uVar2 = z2 ^ z0 ^ z2 << 0xd ^ z0 << 0xb ^ z1 ^ z1 << 7;
        STATE[uVar4] = uVar2;
        uVar2 = (uint)((ulong)(uVar2 >> 4) / (0x10000000 / (ulong)m));
        uVar3 = uVar4;
      } while (m <= uVar2);
    }
  }
  return uVar2;
}

Assistant:

uint32_t Rand_div(uint32_t m)
{
	uint32_t n, r = 0;

	/* Division by zero will result if m is larger than 0x10000000 */
	assert(m <= 0x10000000);

	/* Hack -- simple case */
	if (m <= 1) return (0);

	if (rand_fixed)
		return (rand_fixval * 1000 * (m - 1)) / (100 * 1000);

	/* Partition size */
	n = (0x10000000 / m);

	if (Rand_quick) {
		/* Use a simple RNG */
		/* Wait for it */
		while (1) {
			/* Cycle the generator */
			r = (Rand_value = LCRNG(Rand_value));

			/* Mutate a 28-bit "random" number */
			r = ((r >> 4) & 0x0FFFFFFF) / n;

			/* Done */
			if (r < m) break;
		}
	} else {
		/* Use a complex RNG */
		while (1) {
			/* Get the next pseudorandom number */
			r = WELLRNG1024a();

			/* Mutate a 28-bit "random" number */
			r = ((r >> 4) & 0x0FFFFFFF) / n;

			/* Done */
			if (r < m) break;
		}
	}

	/* Use the value */
	return (r);
}